

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O2

void __thiscall
std::pair<GF2::MM<45UL>,_GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::pair
          (pair<GF2::MM<45UL>,_GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> *this,
          pair<GF2::MM<45UL>,_GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> *param_1)

{
  (this->first).super_WW<45UL>._words[0] = (param_1->first).super_WW<45UL>._words[0];
  __detail::_List_node_header::_List_node_header
            ((_List_node_header *)&this->second,(_List_node_header *)&param_1->second);
  return;
}

Assistant:

WW(const WW& wRight)
	{	
		for (size_t pos = 0; pos < _wcount; ++pos)
			_words[pos] = wRight._words[pos];
	}